

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::queueError<std::__cxx11::wstring,std::__cxx11::wstring>
               (ErrorType type,wchar_t *text,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1)

{
  wstring local_48 [8];
  wstring message;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_local_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_local;
  wchar_t *text_local;
  ErrorType type_local;
  
  formatString<std::__cxx11::wstring,std::__cxx11::wstring>
            ((wchar_t *)local_48,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)text,args
            );
  queueError(type,local_48);
  std::__cxx11::wstring::~wstring((wstring *)local_48);
  return;
}

Assistant:

static void queueError(ErrorType type, const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		queueError(type,message);
	}